

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_stepping.cpp
# Opt level: O2

void test_1d_dynamic<30ul,30ul>(void)

{
  pointer t;
  uint uVar1;
  reference pvVar2;
  int *local_60;
  value_type true_idx;
  vector<int,_std::allocator<int>_> data;
  pointer local_38;
  
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x6d,"void test_1d_dynamic() [N = 30UL, X = 30UL]",(bool *)&data,(bool *)&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x6f,"void test_1d_dynamic() [N = 30UL, X = 30UL]",(unsigned_long *)&data,
             (int *)&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_0000001e;
  true_idx = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x71,"void test_1d_dynamic() [N = 30UL, X = 30UL]",(unsigned_long *)&data,&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_0000001e;
  true_idx = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x72,"void test_1d_dynamic() [N = 30UL, X = 30UL]",(unsigned_long *)&data,&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x78,"void test_1d_dynamic() [N = 30UL, X = 30UL]",(bool *)&data,(bool *)&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_0000001e;
  true_idx = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","N",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x7a,"void test_1d_dynamic() [N = 30UL, X = 30UL]",(unsigned_long *)&data,&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  true_idx = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","X / N",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x7c,"void test_1d_dynamic() [N = 30UL, X = 30UL]",(unsigned_long *)&data,&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&DAT_0000001e;
  true_idx = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x7d,"void test_1d_dynamic() [N = 30UL, X = 30UL]",(unsigned_long *)&data,&true_idx);
  true_idx = CONCAT44(true_idx._4_4_,0x2a);
  std::vector<int,_std::allocator<int>_>::vector
            (&data,0x1e,(value_type_conflict1 *)&true_idx,(allocator_type *)&local_60);
  t = data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  true_idx = 0;
  local_60 = (int *)0x0;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.index(i))","true_idx",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x89,"void test_1d_dynamic() [N = 30UL, X = 30UL]",(unsigned_long *)&local_60,
             &true_idx);
  local_60 = t;
  local_38 = t + true_idx;
  boost::detail::test_eq_impl<int*,int*>
            ("&(dptr[sub_l.index(i)])","&(dptr[true_idx])",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x8b,"void test_1d_dynamic() [N = 30UL, X = 30UL]",&local_60,&local_38);
  *t = 0x11;
  local_60._0_4_ = 0x11;
  boost::detail::test_eq_impl<int,int>
            ("(dptr[sub_l.index(i)])","17",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x8f,"void test_1d_dynamic() [N = 30UL, X = 30UL]",t,(int *)&local_60);
  pvVar2 = std::vector<int,_std::allocator<int>_>::at(&data,0);
  local_60 = (int *)CONCAT44(local_60._4_4_,0x11);
  boost::detail::test_eq_impl<int,int>
            ("(data.at(sub_l.index(i)))","17",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x92,"void test_1d_dynamic() [N = 30UL, X = 30UL]",pvVar2,(int *)&local_60);
  uVar1 = 0;
  while (local_60 = (int *)CONCAT44(local_60._4_4_,uVar1), uVar1 < 0x1e) {
    true_idx = (value_type)uVar1;
    boost::detail::test_eq_impl<unsigned_long,int>
              ("(l.index(i))","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
               ,0x98,"void test_1d_dynamic() [N = 30UL, X = 30UL]",&true_idx,(int *)&local_60);
    if ((ulong)(long)(int)local_60 % 0x1e == 0) {
      true_idx = CONCAT44(true_idx._4_4_,0x11);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i)])","17",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0x9d,"void test_1d_dynamic() [N = 30UL, X = 30UL]",t + (int)local_60,
                 (int *)&true_idx);
      pvVar2 = std::vector<int,_std::allocator<int>_>::at(&data,(long)(int)local_60);
      true_idx = CONCAT44(true_idx._4_4_,0x11);
      boost::detail::test_eq_impl<int,int>
                ("(data.at(l.index(i)))","17",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xa0,"void test_1d_dynamic() [N = 30UL, X = 30UL]",pvVar2,(int *)&true_idx);
    }
    else {
      true_idx = CONCAT44(true_idx._4_4_,0x2a);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xa5,"void test_1d_dynamic() [N = 30UL, X = 30UL]",t + (int)local_60,
                 (int *)&true_idx);
      pvVar2 = std::vector<int,_std::allocator<int>_>::at(&data,(long)(int)local_60);
      true_idx = CONCAT44(true_idx._4_4_,0x2a);
      boost::detail::test_eq_impl<int,int>
                ("(data.at(l.index(i)))","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xa8,"void test_1d_dynamic() [N = 30UL, X = 30UL]",pvVar2,(int *)&true_idx);
    }
    uVar1 = (int)local_60 + 1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&data.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void test_1d_dynamic()
{ // {{{
    static_assert(0 == (X % N), "X must be divisable by N");

    layout_mapping_right<
        dimensions<dyn>, dimensions<dyn>, dimensions<0>
    > const l{{X}, {1}, {}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);

    BOOST_TEST_EQ((l.size()), X);
    BOOST_TEST_EQ((l.span()), X);

    layout_mapping_right<
        dimensions<dyn>, dimensions<dyn>, dimensions<0>
    > const sub_l{{X / N}, {N}, {}};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), N);

    BOOST_TEST_EQ((sub_l.size()), X / N);
    BOOST_TEST_EQ((sub_l.span()), X);

    // Initialize all elements to 42.
    std::vector<int> data(l[0], 42);
    int* dptr = data.data();

    // Set every Nth element to 17. 
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const s = sub_l.stepping();
        auto const true_idx = (s[0] * i);

        BOOST_TEST_EQ((sub_l.index(i)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i)] = 17;

        BOOST_TEST_EQ((dptr[sub_l.index(i)]), 17);

        // Bounds-checking.
        BOOST_TEST_EQ((data.at(sub_l.index(i))), 17);
    }

    // Check final structure.
    for (auto i = 0; i < l[0]; ++i)
    {
        BOOST_TEST_EQ((l.index(i)), i);

        // Element in the strided sub-box.
        if (0 == (i % sub_l.stepping()[0]))
        {
            BOOST_TEST_EQ((dptr[l.index(i)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i))), 17);
        }
        // Element not in the strided sub-box.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i)]), 42);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i))), 42);
        }
    }
}